

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CadicalInterfacing.cpp
# Opt level: O2

void __thiscall
SAT::CadicalInterfacing::collectZeroImplied(CadicalInterfacing *this,SATLiteralStack *acc)

{
  int iVar1;
  int lit;
  uint uVar2;
  uint uVar3;
  
  lit = 1;
  uVar3 = 0xffffffff;
  while( true ) {
    iVar1 = CaDiCaL::Solver::vars(&this->_solver);
    if (iVar1 < lit) break;
    iVar1 = CaDiCaL::Solver::fixed(&this->_solver,lit);
    if (iVar1 != 0) {
      uVar2 = 0;
      if (iVar1 < 1) {
        uVar2 = uVar3;
      }
      Lib::Stack<SAT::SATLiteral>::push(acc,(SATLiteral)(uVar2 >> 0x1f | lit << 1));
    }
    lit = lit + 1;
    uVar3 = uVar3 - 1;
  }
  return;
}

Assistant:

void CadicalInterfacing::collectZeroImplied(SATLiteralStack& acc)
{
  for(int i = 1, val; i <= _solver.vars(); i++)
    if((val = _solver.fixed(i)))
      acc.push(cadical2Vampire(val > 0 ? i : -i));
}